

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O1

bool google::protobuf::internal::WireFormat::ParseAndMergeField
               (uint32 tag,FieldDescriptor *field,Message *message,CodedInputStream *input)

{
  uint8 uVar1;
  byte bVar2;
  byte *pbVar3;
  uint8 *puVar4;
  ulong *puVar5;
  ulong uVar6;
  bool bVar7;
  int iVar8;
  Type TVar9;
  uint32 uVar10;
  undefined4 extraout_var;
  UnknownFieldSet *pUVar12;
  undefined4 extraout_var_00;
  MessageLite *pMVar13;
  int64 iVar14;
  ulong uVar15;
  undefined4 extraout_var_01;
  EnumDescriptor *pEVar16;
  EnumValueDescriptor *pEVar17;
  _Alloc_hider _Var18;
  unsigned_long uVar19;
  ulong uVar20;
  bool *value_00;
  long lVar21;
  int value_1;
  undefined8 unaff_RBP;
  uint first_byte_or_zero;
  long lVar22;
  long lVar23;
  pair<unsigned_long,_bool> pVar24;
  pair<unsigned_long,_bool> pVar25;
  pair<unsigned_long,_bool> pVar26;
  pair<unsigned_long,_bool> pVar27;
  pair<unsigned_long,_bool> pVar28;
  pair<unsigned_long,_bool> pVar29;
  uint64 value;
  string local_60;
  char local_3d;
  Limit local_3c;
  uint64 local_38;
  long *plVar11;
  
  iVar8 = (*(message->super_MessageLite)._vptr_MessageLite[0x16])(message);
  plVar11 = (long *)CONCAT44(extraout_var,iVar8);
  uVar20 = CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
  if (field == (FieldDescriptor *)0x0) {
    bVar7 = false;
  }
  else {
    TVar9 = FieldDescriptor::type(field);
    if ((tag & 7) == *(uint *)(WireFormatLite::kWireTypeForFieldType + (ulong)TVar9 * 4)) {
      uVar20 = 0;
    }
    else if (((*(int *)(field + 0x4c) == 3) &&
             (TVar9 = FieldDescriptor::type(field), (tag & 7) == 2)) &&
            (TVar9 - TYPE_UINT32 < 0xfffffffc)) {
      uVar20 = 0;
      bVar7 = true;
      goto LAB_0033e99f;
    }
    bVar7 = false;
  }
LAB_0033e99f:
  if ((char)uVar20 != '\0') {
    pUVar12 = (UnknownFieldSet *)(**(code **)(*plVar11 + 0x18))(plVar11,message);
    bVar7 = SkipField(input,tag,pUVar12);
    return bVar7;
  }
  if (bVar7) {
    pbVar3 = input->buffer_;
    if (pbVar3 < input->buffer_end_) {
      first_byte_or_zero = (uint)*pbVar3;
      if ((char)*pbVar3 < '\0') goto LAB_0033ef3f;
      input->buffer_ = pbVar3 + 1;
      bVar7 = true;
    }
    else {
      first_byte_or_zero = 0;
LAB_0033ef3f:
      iVar14 = io::CodedInputStream::ReadVarint32Fallback(input,first_byte_or_zero);
      first_byte_or_zero = (uint)iVar14;
      bVar7 = -1 < iVar14;
    }
    if (!bVar7) {
      return false;
    }
    local_3c = io::CodedInputStream::PushLimit(input,first_byte_or_zero);
    TVar9 = FieldDescriptor::type(field);
    switch(TVar9) {
    case TYPE_DOUBLE:
      iVar8 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar8) {
        do {
          puVar5 = (ulong *)input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)puVar5 < 8) {
            bVar7 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64 *)&local_60);
          }
          else {
            local_60._M_dataplus._M_p = (pointer)*puVar5;
            input->buffer_ = (uint8 *)(puVar5 + 1);
            bVar7 = true;
          }
          if (bVar7 == false) {
            return false;
          }
          (**(code **)(*plVar11 + 0x230))(local_60._M_dataplus._M_p,plVar11,message,field);
          iVar8 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar8);
      }
      break;
    case TYPE_FLOAT:
      iVar8 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar8) {
        do {
          puVar4 = input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)puVar4 < 4) {
            bVar7 = io::CodedInputStream::ReadLittleEndian32Fallback(input,(uint32 *)&local_60);
          }
          else {
            local_60._M_dataplus._M_p._0_4_ = *(undefined4 *)puVar4;
            input->buffer_ = puVar4 + 4;
            bVar7 = true;
          }
          if (bVar7 == false) {
            return false;
          }
          (**(code **)(*plVar11 + 0x228))
                    ((ulong)local_60._M_dataplus._M_p & 0xffffffff,plVar11,message,field);
          iVar8 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar8);
      }
      break;
    case TYPE_INT64:
      while (iVar8 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar8) {
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) &&
           (uVar19 = (unsigned_long)(char)*puVar4, -1 < (long)uVar19)) {
          input->buffer_ = puVar4 + 1;
          pVar29._8_8_ = 1;
          pVar29.first = (unsigned_long)(puVar4 + 1);
        }
        else {
          pVar29 = io::CodedInputStream::ReadVarint64Fallback(input);
          uVar19 = pVar29.first;
        }
        if (((undefined1  [16])pVar29 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
        (**(code **)(*plVar11 + 0x210))(plVar11,message,field,uVar19);
      }
      break;
    case TYPE_UINT64:
      while (iVar8 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar8) {
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) &&
           (uVar19 = (unsigned_long)(char)*puVar4, -1 < (long)uVar19)) {
          input->buffer_ = puVar4 + 1;
          pVar27._8_8_ = 1;
          pVar27.first = (unsigned_long)(puVar4 + 1);
        }
        else {
          pVar27 = io::CodedInputStream::ReadVarint64Fallback(input);
          uVar19 = pVar27.first;
        }
        if (((undefined1  [16])pVar27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
        (**(code **)(*plVar11 + 0x220))(plVar11,message,field,uVar19);
      }
      break;
    case TYPE_INT32:
      while (iVar8 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar8) {
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          uVar10 = (uint32)*pbVar3;
          if ((char)*pbVar3 < '\0') goto LAB_0033f1f2;
          input->buffer_ = pbVar3 + 1;
          bVar7 = true;
        }
        else {
          uVar10 = 0;
LAB_0033f1f2:
          iVar14 = io::CodedInputStream::ReadVarint32Fallback(input,uVar10);
          bVar7 = -1 < iVar14;
        }
        if (!bVar7) {
          return false;
        }
        (**(code **)(*plVar11 + 0x208))(plVar11,message,field);
      }
      break;
    case TYPE_FIXED64:
      iVar8 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar8) {
        do {
          puVar5 = (ulong *)input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)puVar5 < 8) {
            bVar7 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64 *)&local_60);
            if (!bVar7) {
              return false;
            }
          }
          else {
            local_60._M_dataplus._M_p = (pointer)*puVar5;
            input->buffer_ = (uint8 *)(puVar5 + 1);
          }
          (**(code **)(*plVar11 + 0x220))(plVar11,message,field,local_60._M_dataplus._M_p);
          iVar8 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar8);
      }
      break;
    case TYPE_FIXED32:
      iVar8 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar8) {
        do {
          puVar4 = input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)puVar4 < 4) {
            bVar7 = io::CodedInputStream::ReadLittleEndian32Fallback(input,(uint32 *)&local_60);
            if (!bVar7) {
              return false;
            }
          }
          else {
            local_60._M_dataplus._M_p._0_4_ = *(undefined4 *)puVar4;
            input->buffer_ = puVar4 + 4;
          }
          (**(code **)(*plVar11 + 0x218))
                    (plVar11,message,field,(ulong)local_60._M_dataplus._M_p & 0xffffffff);
          iVar8 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar8);
      }
      break;
    case TYPE_BOOL:
      while (iVar8 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar8) {
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) && (uVar1 = *puVar4, -1 < (long)(char)uVar1)) {
          input->buffer_ = puVar4 + 1;
          pVar26._8_8_ = 1;
          pVar26.first = (long)(char)uVar1;
        }
        else {
          pVar26 = io::CodedInputStream::ReadVarint64Fallback(input);
        }
        if (((undefined1  [16])pVar26 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
        (**(code **)(*plVar11 + 0x238))(plVar11,message,field,pVar26.first != 0);
      }
      break;
    case TYPE_STRING:
    case TYPE_GROUP:
    case TYPE_MESSAGE:
    case TYPE_BYTES:
      goto LAB_0033f5d7;
    case TYPE_UINT32:
      while (iVar8 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar8) {
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          uVar10 = (uint32)*pbVar3;
          if ((char)*pbVar3 < '\0') goto LAB_0033f079;
          input->buffer_ = pbVar3 + 1;
          bVar7 = true;
        }
        else {
          uVar10 = 0;
LAB_0033f079:
          iVar14 = io::CodedInputStream::ReadVarint32Fallback(input,uVar10);
          bVar7 = -1 < iVar14;
        }
        if (!bVar7) {
          return false;
        }
        (**(code **)(*plVar11 + 0x218))(plVar11,message,field);
      }
      break;
    case TYPE_ENUM:
      while (iVar8 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar8) {
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          bVar2 = *pbVar3;
          uVar15 = (ulong)bVar2;
          uVar10 = (uint32)bVar2;
          if ((char)bVar2 < '\0') goto LAB_0033f4ae;
          input->buffer_ = pbVar3 + 1;
          local_3d = true;
        }
        else {
          uVar10 = 0;
LAB_0033f4ae:
          uVar15 = io::CodedInputStream::ReadVarint32Fallback(input,uVar10);
          local_3d = -1 < (long)uVar15;
        }
        uVar6 = uVar20;
        if ((bool)local_3d != false) {
          uVar6 = uVar15;
        }
        uVar20 = uVar6 & 0xffffffff;
        if ((bool)local_3d == false) {
          return false;
        }
        iVar8 = (*(message->super_MessageLite)._vptr_MessageLite[0x17])(message);
        if (*(int *)(*(long *)(CONCAT44(extraout_var_01,iVar8) + 0x10) + 0x8c) == 3) {
          (**(code **)(*plVar11 + 0x250))(plVar11,message,field,uVar20);
        }
        else {
          pEVar16 = FieldDescriptor::enum_type(field);
          pEVar17 = EnumDescriptor::FindValueByNumber(pEVar16,(int)uVar6);
          if (pEVar17 == (EnumValueDescriptor *)0x0) {
            local_38 = (uint64)(int)uVar6;
            pUVar12 = (UnknownFieldSet *)(**(code **)(*plVar11 + 0x18))(plVar11,message);
            UnknownFieldSet::AddVarint(pUVar12,tag >> 3,local_38);
          }
          else {
            (**(code **)(*plVar11 + 0x248))(plVar11,message,field,pEVar17);
          }
        }
        if (local_3d == '\0') {
          return false;
        }
      }
      break;
    case TYPE_SFIXED32:
      iVar8 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar8) {
        do {
          puVar4 = input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)puVar4 < 4) {
            bVar7 = io::CodedInputStream::ReadLittleEndian32Fallback(input,(uint32 *)&local_60);
          }
          else {
            local_60._M_dataplus._M_p._0_4_ = *(undefined4 *)puVar4;
            input->buffer_ = puVar4 + 4;
            bVar7 = true;
          }
          if (bVar7 == false) {
            return false;
          }
          (**(code **)(*plVar11 + 0x208))
                    (plVar11,message,field,(ulong)local_60._M_dataplus._M_p & 0xffffffff);
          iVar8 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar8);
      }
      break;
    case TYPE_SFIXED64:
      iVar8 = io::CodedInputStream::BytesUntilLimit(input);
      if (0 < iVar8) {
        do {
          puVar5 = (ulong *)input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)puVar5 < 8) {
            bVar7 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64 *)&local_60);
          }
          else {
            local_60._M_dataplus._M_p = (pointer)*puVar5;
            input->buffer_ = (uint8 *)(puVar5 + 1);
            bVar7 = true;
          }
          if (bVar7 == false) {
            return false;
          }
          (**(code **)(*plVar11 + 0x210))(plVar11,message,field,local_60._M_dataplus._M_p);
          iVar8 = io::CodedInputStream::BytesUntilLimit(input);
        } while (0 < iVar8);
      }
      break;
    case TYPE_SINT32:
      while (iVar8 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar8) {
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          uVar10 = (uint32)*pbVar3;
          if ((char)*pbVar3 < '\0') goto LAB_0033efb1;
          input->buffer_ = pbVar3 + 1;
          bVar7 = true;
        }
        else {
          uVar10 = 0;
LAB_0033efb1:
          iVar14 = io::CodedInputStream::ReadVarint32Fallback(input,uVar10);
          bVar7 = -1 < iVar14;
        }
        if (!bVar7) {
          return false;
        }
        (**(code **)(*plVar11 + 0x208))(plVar11,message,field);
      }
      break;
    case MAX_TYPE:
      while (iVar8 = io::CodedInputStream::BytesUntilLimit(input), 0 < iVar8) {
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) && (uVar20 = (ulong)(char)*puVar4, -1 < (long)uVar20)) {
          input->buffer_ = puVar4 + 1;
          pVar28._8_8_ = 1;
          pVar28.first = (unsigned_long)(puVar4 + 1);
        }
        else {
          pVar28 = io::CodedInputStream::ReadVarint64Fallback(input);
          uVar20 = pVar28.first;
        }
        if (((undefined1  [16])pVar28 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
        (**(code **)(*plVar11 + 0x210))
                  (plVar11,message,field,-(ulong)((uint)uVar20 & 1) ^ uVar20 >> 1);
      }
    }
    io::CodedInputStream::PopLimit(input,local_3c);
    return true;
  }
  TVar9 = FieldDescriptor::type(field);
  switch(TVar9) {
  case TYPE_DOUBLE:
    bVar7 = WireFormatLite::
            ReadPrimitive<double,(google::protobuf::internal::WireFormatLite::FieldType)1>
                      (input,(double *)&local_60);
    if (!bVar7) {
      return false;
    }
    iVar8 = *(int *)(field + 0x4c);
    lVar22 = *plVar11;
    lVar21 = 0x230;
    lVar23 = 0x110;
    goto LAB_0033ec3b;
  case TYPE_FLOAT:
    bVar7 = WireFormatLite::
            ReadPrimitive<float,(google::protobuf::internal::WireFormatLite::FieldType)2>
                      (input,(float *)&local_60);
    if (!bVar7) {
      return false;
    }
    iVar8 = *(int *)(field + 0x4c);
    local_60._M_dataplus._M_p = local_60._M_dataplus._M_p & 0xffffffff;
    lVar22 = *plVar11;
    lVar21 = 0x228;
    lVar23 = 0x108;
LAB_0033ec3b:
    if (iVar8 == 3) {
      lVar23 = lVar21;
    }
    (**(code **)(lVar22 + lVar23))(local_60._M_dataplus._M_p,plVar11,message,field);
    return true;
  case TYPE_INT64:
    puVar4 = input->buffer_;
    if ((puVar4 < input->buffer_end_) &&
       (_Var18._M_p = (pointer)(long)(char)*puVar4, -1 < (long)_Var18._M_p)) {
      input->buffer_ = puVar4 + 1;
      pVar24._8_8_ = 1;
      pVar24.first = (unsigned_long)(puVar4 + 1);
    }
    else {
      pVar24 = io::CodedInputStream::ReadVarint64Fallback(input);
      _Var18._M_p = (pointer)pVar24.first;
    }
    if (((undefined1  [16])pVar24 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      return false;
    }
    iVar8 = *(int *)(field + 0x4c);
    goto LAB_0033ee21;
  case TYPE_UINT64:
    puVar4 = input->buffer_;
    if ((puVar4 < input->buffer_end_) &&
       (_Var18._M_p = (pointer)(long)(char)*puVar4, -1 < (long)_Var18._M_p)) {
      input->buffer_ = puVar4 + 1;
      pVar25._8_8_ = 1;
      pVar25.first = (unsigned_long)(puVar4 + 1);
    }
    else {
      pVar25 = io::CodedInputStream::ReadVarint64Fallback(input);
      _Var18._M_p = (pointer)pVar25.first;
    }
    if (((undefined1  [16])pVar25 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      return false;
    }
    iVar8 = *(int *)(field + 0x4c);
    goto LAB_0033ee4a;
  case TYPE_INT32:
    bVar7 = WireFormatLite::
            ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
                      (input,(int32 *)&local_60);
    break;
  case TYPE_FIXED64:
    puVar5 = (ulong *)input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)puVar5 < 8) {
      bVar7 = io::CodedInputStream::ReadLittleEndian64Fallback(input,(uint64 *)&local_60);
      if (!bVar7) {
        return false;
      }
    }
    else {
      local_60._M_dataplus._M_p = (pointer)*puVar5;
      input->buffer_ = (uint8 *)(puVar5 + 1);
    }
    iVar8 = *(int *)(field + 0x4c);
    _Var18._M_p = local_60._M_dataplus._M_p;
LAB_0033ee4a:
    lVar22 = *plVar11;
    lVar21 = 0x220;
    lVar23 = 0x100;
LAB_0033ee59:
    if (iVar8 == 3) {
      lVar23 = lVar21;
    }
    (**(code **)(lVar22 + lVar23))(plVar11,message,field,_Var18._M_p);
    return true;
  case TYPE_FIXED32:
    puVar4 = input->buffer_;
    if (*(int *)&input->buffer_end_ - (int)puVar4 < 4) {
      bVar7 = io::CodedInputStream::ReadLittleEndian32Fallback(input,(uint32 *)&local_60);
      goto LAB_0033eb28;
    }
    local_60._M_dataplus._M_p._0_4_ = *(undefined4 *)puVar4;
    input->buffer_ = puVar4 + 4;
    goto LAB_0033ed22;
  case TYPE_BOOL:
    bVar7 = WireFormatLite::
            ReadPrimitive<bool,(google::protobuf::internal::WireFormatLite::FieldType)8>
                      ((WireFormatLite *)input,(CodedInputStream *)&local_60,value_00);
    if (!bVar7) {
      return false;
    }
    bVar7 = *(int *)(field + 0x4c) == 3;
    uVar20 = (ulong)local_60._M_dataplus._M_p & 0xff;
    lVar22 = *plVar11;
    lVar21 = 0x238;
    lVar23 = 0x118;
    goto LAB_0033ed39;
  case TYPE_STRING:
    iVar8 = *(int *)(*(long *)(field + 0x30) + 0x8c);
    local_60._M_string_length = 0;
    local_60.field_2._M_local_buf[0] = '\0';
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    bVar7 = WireFormatLite::ReadBytes(input,&local_60);
    if (bVar7) {
      if (iVar8 == 3) {
        bVar7 = WireFormatLite::VerifyUtf8String
                          (local_60._M_dataplus._M_p,(int)local_60._M_string_length,PARSE,
                           (char *)**(undefined8 **)(field + 8));
        if (!bVar7) goto LAB_0033ede9;
      }
      else {
        WireFormatLite::VerifyUtf8String
                  (local_60._M_dataplus._M_p,(int)local_60._M_string_length,PARSE,
                   (char *)**(undefined8 **)(field + 8));
      }
      lVar22 = 0x120;
      if (*(int *)(field + 0x4c) == 3) {
        lVar22 = 0x240;
      }
      (**(code **)(*plVar11 + lVar22))(plVar11,message,field,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p == &local_60.field_2) {
        return true;
      }
      operator_delete(local_60._M_dataplus._M_p,
                      CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                               local_60.field_2._M_local_buf[0]) + 1);
      return true;
    }
    goto LAB_0033ede9;
  case TYPE_GROUP:
    lVar22 = 0x138;
    if (*(int *)(field + 0x4c) == 3) {
      lVar22 = 600;
    }
    pMVar13 = (MessageLite *)
              (**(code **)(*plVar11 + lVar22))(plVar11,message,field,input->extension_factory_);
    bVar7 = WireFormatLite::ReadGroup(tag >> 3,input,pMVar13);
    goto joined_r0x0033ef36;
  case TYPE_MESSAGE:
    lVar22 = 0x138;
    if (*(int *)(field + 0x4c) == 3) {
      lVar22 = 600;
    }
    pMVar13 = (MessageLite *)
              (**(code **)(*plVar11 + lVar22))(plVar11,message,field,input->extension_factory_);
    bVar7 = WireFormatLite::ReadMessage(input,pMVar13);
    goto joined_r0x0033ef36;
  case TYPE_BYTES:
    local_60._M_string_length = 0;
    local_60.field_2._M_local_buf[0] = '\0';
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    bVar7 = WireFormatLite::ReadBytes(input,&local_60);
    if (bVar7) {
      lVar22 = 0x120;
      if (*(int *)(field + 0x4c) == 3) {
        lVar22 = 0x240;
      }
      (**(code **)(*plVar11 + lVar22))(plVar11,message,field,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,
                        CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                                 local_60.field_2._M_local_buf[0]) + 1);
      }
      goto joined_r0x0033ef36;
    }
LAB_0033ede9:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p == &local_60.field_2) {
      return false;
    }
    operator_delete(local_60._M_dataplus._M_p,
                    CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                             local_60.field_2._M_local_buf[0]) + 1);
    return false;
  case TYPE_UINT32:
    bVar7 = WireFormatLite::
            ReadPrimitive<unsigned_int,(google::protobuf::internal::WireFormatLite::FieldType)13>
                      (input,(uint32 *)&local_60);
LAB_0033eb28:
    if (bVar7 == false) {
      return false;
    }
LAB_0033ed22:
    bVar7 = *(int *)(field + 0x4c) == 3;
    uVar20 = (ulong)local_60._M_dataplus._M_p & 0xffffffff;
    lVar22 = *plVar11;
    lVar21 = 0x218;
    lVar23 = 0xf8;
    goto LAB_0033ed39;
  case TYPE_ENUM:
    bVar7 = WireFormatLite::
            ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)14>
                      (input,(int *)&local_60);
    if (!bVar7) {
      return false;
    }
    iVar8 = (*(message->super_MessageLite)._vptr_MessageLite[0x17])(message);
    if (*(int *)(*(long *)(CONCAT44(extraout_var_00,iVar8) + 0x10) + 0x8c) == 3) {
      if (*(int *)(field + 0x4c) == 3) {
        (**(code **)(*plVar11 + 0x250))();
      }
      else {
        (**(code **)(*plVar11 + 0x130))
                  (plVar11,message,field,(ulong)local_60._M_dataplus._M_p & 0xffffffff);
      }
    }
    else {
      pEVar16 = FieldDescriptor::enum_type(field);
      pEVar17 = EnumDescriptor::FindValueByNumber(pEVar16,(int)local_60._M_dataplus._M_p);
      if (pEVar17 == (EnumValueDescriptor *)0x0) {
        pUVar12 = (UnknownFieldSet *)(**(code **)(*plVar11 + 0x18))(plVar11,message);
        UnknownFieldSet::AddVarint(pUVar12,tag >> 3,(long)(int)local_60._M_dataplus._M_p);
      }
      else if (*(int *)(field + 0x4c) == 3) {
        (**(code **)(*plVar11 + 0x248))();
      }
      else {
        (**(code **)(*plVar11 + 0x128))(plVar11,message,field,pEVar17);
      }
    }
joined_r0x0033ef36:
    if (bVar7 != false) {
      return true;
    }
    return false;
  case TYPE_SFIXED32:
    bVar7 = WireFormatLite::
            ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)15>
                      (input,(int32 *)&local_60);
    break;
  case TYPE_SFIXED64:
    bVar7 = WireFormatLite::
            ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)16>
                      (input,(int64 *)&local_60);
    goto LAB_0033ec5e;
  case TYPE_SINT32:
    bVar7 = WireFormatLite::
            ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)17>
                      (input,(int32 *)&local_60);
    break;
  case MAX_TYPE:
    bVar7 = WireFormatLite::
            ReadPrimitive<long,(google::protobuf::internal::WireFormatLite::FieldType)18>
                      ((WireFormatLite *)input,(CodedInputStream *)&local_60,(int64 *)value_00);
LAB_0033ec5e:
    if (bVar7 == false) {
      return false;
    }
    iVar8 = *(int *)(field + 0x4c);
    _Var18._M_p = local_60._M_dataplus._M_p;
LAB_0033ee21:
    lVar22 = *plVar11;
    lVar21 = 0x210;
    lVar23 = 0xf0;
    goto LAB_0033ee59;
  default:
    goto LAB_0033f5d7;
  }
  if (bVar7 == false) {
LAB_0033f5d7:
    return false;
  }
  bVar7 = *(int *)(field + 0x4c) == 3;
  uVar20 = (ulong)local_60._M_dataplus._M_p & 0xffffffff;
  lVar22 = *plVar11;
  lVar21 = 0x208;
  lVar23 = 0xe8;
LAB_0033ed39:
  if (bVar7) {
    lVar23 = lVar21;
  }
  (**(code **)(lVar22 + lVar23))(plVar11,message,field,uVar20);
LAB_0033f5d7:
  return true;
}

Assistant:

bool WireFormat::ParseAndMergeField(
    uint32 tag,
    const FieldDescriptor* field,        // May be NULL for unknown
    Message* message,
    io::CodedInputStream* input) {
  const Reflection* message_reflection = message->GetReflection();

  enum { UNKNOWN, NORMAL_FORMAT, PACKED_FORMAT } value_format;

  if (field == NULL) {
    value_format = UNKNOWN;
  } else if (WireFormatLite::GetTagWireType(tag) ==
             WireTypeForFieldType(field->type())) {
    value_format = NORMAL_FORMAT;
  } else if (field->is_packable() &&
             WireFormatLite::GetTagWireType(tag) ==
             WireFormatLite::WIRETYPE_LENGTH_DELIMITED) {
    value_format = PACKED_FORMAT;
  } else {
    // We don't recognize this field. Either the field number is unknown
    // or the wire type doesn't match. Put it in our unknown field set.
    value_format = UNKNOWN;
  }

  if (value_format == UNKNOWN) {
    return SkipField(input, tag,
                     message_reflection->MutableUnknownFields(message));
  } else if (value_format == PACKED_FORMAT) {
    uint32 length;
    if (!input->ReadVarint32(&length)) return false;
    io::CodedInputStream::Limit limit = input->PushLimit(length);

    switch (field->type()) {
#define HANDLE_PACKED_TYPE(TYPE, CPPTYPE, CPPTYPE_METHOD)                      \
      case FieldDescriptor::TYPE_##TYPE: {                                     \
        while (input->BytesUntilLimit() > 0) {                                 \
          CPPTYPE value;                                                       \
          if (!WireFormatLite::ReadPrimitive<                                  \
                CPPTYPE, WireFormatLite::TYPE_##TYPE>(input, &value))          \
            return false;                                                      \
          message_reflection->Add##CPPTYPE_METHOD(message, field, value);      \
        }                                                                      \
        break;                                                                 \
      }

      HANDLE_PACKED_TYPE( INT32,  int32,  Int32)
      HANDLE_PACKED_TYPE( INT64,  int64,  Int64)
      HANDLE_PACKED_TYPE(SINT32,  int32,  Int32)
      HANDLE_PACKED_TYPE(SINT64,  int64,  Int64)
      HANDLE_PACKED_TYPE(UINT32, uint32, UInt32)
      HANDLE_PACKED_TYPE(UINT64, uint64, UInt64)

      HANDLE_PACKED_TYPE( FIXED32, uint32, UInt32)
      HANDLE_PACKED_TYPE( FIXED64, uint64, UInt64)
      HANDLE_PACKED_TYPE(SFIXED32,  int32,  Int32)
      HANDLE_PACKED_TYPE(SFIXED64,  int64,  Int64)

      HANDLE_PACKED_TYPE(FLOAT , float , Float )
      HANDLE_PACKED_TYPE(DOUBLE, double, Double)

      HANDLE_PACKED_TYPE(BOOL, bool, Bool)
#undef HANDLE_PACKED_TYPE

      case FieldDescriptor::TYPE_ENUM: {
        while (input->BytesUntilLimit() > 0) {
          int value;
          if (!WireFormatLite::ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(
                  input, &value)) return false;
          if (message->GetDescriptor()->file()->syntax() ==
              FileDescriptor::SYNTAX_PROTO3) {
            message_reflection->AddEnumValue(message, field, value);
          } else {
            const EnumValueDescriptor* enum_value =
                field->enum_type()->FindValueByNumber(value);
            if (enum_value != NULL) {
              message_reflection->AddEnum(message, field, enum_value);
            } else {
              // The enum value is not one of the known values.  Add it to the
              // UnknownFieldSet.
              int64 sign_extended_value = static_cast<int64>(value);
              message_reflection->MutableUnknownFields(message)
                  ->AddVarint(
                      WireFormatLite::GetTagFieldNumber(tag),
                      sign_extended_value);
            }
          }
        }

        break;
      }

      case FieldDescriptor::TYPE_STRING:
      case FieldDescriptor::TYPE_GROUP:
      case FieldDescriptor::TYPE_MESSAGE:
      case FieldDescriptor::TYPE_BYTES:
        // Can't have packed fields of these types: these should be caught by
        // the protocol compiler.
        return false;
        break;
    }

    input->PopLimit(limit);
  } else {
    // Non-packed value (value_format == NORMAL_FORMAT)
    switch (field->type()) {
#define HANDLE_TYPE(TYPE, CPPTYPE, CPPTYPE_METHOD)                            \
      case FieldDescriptor::TYPE_##TYPE: {                                    \
        CPPTYPE value;                                                        \
        if (!WireFormatLite::ReadPrimitive<                                   \
                CPPTYPE, WireFormatLite::TYPE_##TYPE>(input, &value))         \
          return false;                                                       \
        if (field->is_repeated()) {                                           \
          message_reflection->Add##CPPTYPE_METHOD(message, field, value);     \
        } else {                                                              \
          message_reflection->Set##CPPTYPE_METHOD(message, field, value);     \
        }                                                                     \
        break;                                                                \
      }

      HANDLE_TYPE( INT32,  int32,  Int32)
      HANDLE_TYPE( INT64,  int64,  Int64)
      HANDLE_TYPE(SINT32,  int32,  Int32)
      HANDLE_TYPE(SINT64,  int64,  Int64)
      HANDLE_TYPE(UINT32, uint32, UInt32)
      HANDLE_TYPE(UINT64, uint64, UInt64)

      HANDLE_TYPE( FIXED32, uint32, UInt32)
      HANDLE_TYPE( FIXED64, uint64, UInt64)
      HANDLE_TYPE(SFIXED32,  int32,  Int32)
      HANDLE_TYPE(SFIXED64,  int64,  Int64)

      HANDLE_TYPE(FLOAT , float , Float )
      HANDLE_TYPE(DOUBLE, double, Double)

      HANDLE_TYPE(BOOL, bool, Bool)
#undef HANDLE_TYPE

      case FieldDescriptor::TYPE_ENUM: {
        int value;
        if (!WireFormatLite::ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(
                input, &value)) return false;
        if (message->GetDescriptor()->file()->syntax() ==
            FileDescriptor::SYNTAX_PROTO3) {
          if (field->is_repeated()) {
            message_reflection->AddEnumValue(message, field, value);
          } else {
            message_reflection->SetEnumValue(message, field, value);
          }
        } else {
          const EnumValueDescriptor* enum_value =
              field->enum_type()->FindValueByNumber(value);
          if (enum_value != NULL) {
            if (field->is_repeated()) {
              message_reflection->AddEnum(message, field, enum_value);
            } else {
              message_reflection->SetEnum(message, field, enum_value);
            }
          } else {
            // The enum value is not one of the known values.  Add it to the
            // UnknownFieldSet.
            int64 sign_extended_value = static_cast<int64>(value);
            message_reflection->MutableUnknownFields(message)
                              ->AddVarint(
                                  WireFormatLite::GetTagFieldNumber(tag),
                                  sign_extended_value);
          }
        }
        break;
      }

      // Handle strings separately so that we can optimize the ctype=CORD case.
      case FieldDescriptor::TYPE_STRING: {
        bool strict_utf8_check = StrictUtf8Check(field);
        string value;
        if (!WireFormatLite::ReadString(input, &value)) return false;
        if (strict_utf8_check) {
          if (!WireFormatLite::VerifyUtf8String(
                  value.data(), value.length(), WireFormatLite::PARSE,
                  field->full_name().c_str())) {
            return false;
          }
        } else {
          VerifyUTF8StringNamedField(value.data(), value.length(), PARSE,
                                     field->full_name().c_str());
        }
        if (field->is_repeated()) {
          message_reflection->AddString(message, field, value);
        } else {
          message_reflection->SetString(message, field, value);
        }
        break;
      }

      case FieldDescriptor::TYPE_BYTES: {
        string value;
        if (!WireFormatLite::ReadBytes(input, &value)) return false;
        if (field->is_repeated()) {
          message_reflection->AddString(message, field, value);
        } else {
          message_reflection->SetString(message, field, value);
        }
        break;
      }

      case FieldDescriptor::TYPE_GROUP: {
        Message* sub_message;
        if (field->is_repeated()) {
          sub_message = message_reflection->AddMessage(
              message, field, input->GetExtensionFactory());
        } else {
          sub_message = message_reflection->MutableMessage(
              message, field, input->GetExtensionFactory());
        }

        if (!WireFormatLite::ReadGroup(WireFormatLite::GetTagFieldNumber(tag),
                                       input, sub_message))
          return false;
        break;
      }

      case FieldDescriptor::TYPE_MESSAGE: {
        Message* sub_message;
        if (field->is_repeated()) {
          sub_message = message_reflection->AddMessage(
              message, field, input->GetExtensionFactory());
        } else {
          sub_message = message_reflection->MutableMessage(
              message, field, input->GetExtensionFactory());
        }

        if (!WireFormatLite::ReadMessage(input, sub_message)) return false;
        break;
      }
    }
  }

  return true;
}